

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# application.cpp
# Opt level: O0

void __thiscall CGL::Application::render(Application *this)

{
  int iVar1;
  long in_RDI;
  Scene *unaff_retaddr;
  Application *in_stack_00000090;
  Application *in_stack_00000170;
  uint in_stack_fffffffffffffff0;
  
  update_gl_camera(in_stack_00000090);
  iVar1 = *(int *)(in_RDI + 0x18);
  if (iVar1 == 0) {
    if ((*(byte *)(in_RDI + 0x410) & 1) != 0) {
      draw_coordinates((Application *)(ulong)in_stack_fffffffffffffff0);
    }
    GLScene::Scene::render_in_opengl(unaff_retaddr);
    if ((*(byte *)(in_RDI + 0x411) & 1) != 0) {
      draw_hud(in_stack_00000170);
    }
  }
  else {
    if (iVar1 != 1) {
      if (iVar1 != 2) goto LAB_00177f7f;
      if ((*(byte *)(in_RDI + 0x410) & 1) != 0) {
        draw_coordinates((Application *)CONCAT44(2,in_stack_fffffffffffffff0));
      }
    }
    (**(code **)(**(long **)(in_RDI + 0x28) + 0x28))();
  }
LAB_00177f7f:
  VisualDebugger::render(*(VisualDebugger **)(in_RDI + 0x10));
  return;
}

Assistant:

void Application::render() {
  update_gl_camera();
  switch (mode) {
    case EDIT_MODE:
      if (show_coordinates) draw_coordinates();
      scene->render_in_opengl();
      if (show_hud) draw_hud();
      break;
    case VISUALIZE_MODE:
      if (show_coordinates) draw_coordinates();
    case RENDER_MODE:
      renderer->update_screen();
      break;
  }

  debugger->render();
}